

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_iter.cpp
# Opt level: O0

void __thiscall
ON_SubDFaceIterator::ON_SubDFaceIterator(ON_SubDFaceIterator *this,ON_SubD *subd,uint level_index)

{
  ON_SubDRef local_48 [2];
  ON_SubDLevel *local_28;
  ON_SubDLevel *level;
  ON_SubD *pOStack_18;
  uint level_index_local;
  ON_SubD *subd_local;
  ON_SubDFaceIterator *this_local;
  
  level._4_4_ = level_index;
  pOStack_18 = subd;
  subd_local = (ON_SubD *)this;
  ON_SubDRef::ON_SubDRef(&this->m_subd_ref);
  this->m_face_first = (ON_SubDFace *)0x0;
  this->m_face_last = (ON_SubDFace *)0x0;
  this->m_face_current = (ON_SubDFace *)0x0;
  this->m_face_index = 0;
  this->m_face_count = 0;
  (this->m_component_ptr).m_ptr = 0;
  local_28 = ON_SubD::LevelForExperts(pOStack_18,level._4_4_);
  ON_SubDRef::CreateReferenceForExperts(local_48,pOStack_18);
  Internal_Init(this,local_48,local_28->m_face_count,local_28->m_face[0],local_28->m_face[1],
                (ON_SubDComponentPtr)0x0);
  ON_SubDRef::~ON_SubDRef(local_48);
  return;
}

Assistant:

ON_SubDFaceIterator::ON_SubDFaceIterator(
  const class ON_SubD& subd,
  unsigned level_index

)
{
  const ON_SubDLevel& level = subd.LevelForExperts(level_index);
  Internal_Init(
    ON_SubDRef::CreateReferenceForExperts(subd),
    level.m_face_count,
    level.m_face[0],
    level.m_face[1],
    ON_SubDComponentPtr::Null
  );
}